

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall Node::Dump(Node *this,char *prefix)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  TimeStamp TVar4;
  TimeStamp TVar5;
  char *pcVar6;
  Edge *pEVar7;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar8;
  reference ppEVar9;
  char *local_58;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_28;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_20;
  const_iterator e;
  char *prefix_local;
  Node *this_local;
  
  e._M_current = (Edge **)prefix;
  path_abi_cxx11_(this);
  uVar3 = std::__cxx11::string::c_str();
  TVar4 = mtime(this);
  TVar5 = mtime(this);
  pcVar6 = " (:missing)";
  if (TVar5 != 0) {
    pcVar6 = "";
  }
  bVar1 = dirty(this);
  if (bVar1) {
    local_58 = " dirty";
  }
  else {
    local_58 = " clean";
  }
  printf("%s <%s 0x%p> mtime: %ld%s, (:%s), ",prefix,uVar3,this,TVar4,pcVar6,local_58);
  pEVar7 = in_edge(this);
  if (pEVar7 == (Edge *)0x0) {
    printf("no in-edge\n");
  }
  else {
    pEVar7 = in_edge(this);
    Edge::Dump(pEVar7,"in-edge: ");
  }
  printf(" out edges:\n");
  pvVar8 = out_edges(this);
  local_20._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar8);
  while( true ) {
    pvVar8 = out_edges(this);
    local_28._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar8);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
    bVar1 = false;
    if (bVar2) {
      ppEVar9 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_20);
      bVar1 = *ppEVar9 != (Edge *)0x0;
    }
    if (!bVar1) break;
    ppEVar9 = __gnu_cxx::
              __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_20);
    Edge::Dump(*ppEVar9," +- ");
    __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
    operator++(&local_20);
  }
  return;
}

Assistant:

void Node::Dump(const char* prefix) const {
  printf("%s <%s 0x%p> mtime: %" PRId64 "%s, (:%s), ",
         prefix, path().c_str(), this,
         mtime(), mtime() ? "" : " (:missing)",
         dirty() ? " dirty" : " clean");
  if (in_edge()) {
    in_edge()->Dump("in-edge: ");
  } else {
    printf("no in-edge\n");
  }
  printf(" out edges:\n");
  for (vector<Edge*>::const_iterator e = out_edges().begin();
       e != out_edges().end() && *e != NULL; ++e) {
    (*e)->Dump(" +- ");
  }
}